

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O2

int dhm_check_range(mbedtls_mpi *param,mbedtls_mpi *P)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi U;
  mbedtls_mpi L;
  
  mbedtls_mpi_init(&L);
  mbedtls_mpi_init(&U);
  iVar1 = mbedtls_mpi_lset(&L,2);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_sub_int(&U,P,2), iVar1 == 0)) {
    iVar2 = mbedtls_mpi_cmp_mpi(param,&L);
    iVar1 = 0;
    if (-1 < iVar2) {
      mbedtls_mpi_cmp_mpi(param,&U);
    }
  }
  mbedtls_mpi_free(&L);
  mbedtls_mpi_free(&U);
  return iVar1;
}

Assistant:

static int dhm_check_range( const mbedtls_mpi *param, const mbedtls_mpi *P )
{
    mbedtls_mpi L, U;
    int ret = MBEDTLS_ERR_DHM_BAD_INPUT_DATA;

    mbedtls_mpi_init( &L ); mbedtls_mpi_init( &U );

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &L, 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &U, P, 2 ) );

    if( mbedtls_mpi_cmp_mpi( param, &L ) >= 0 &&
        mbedtls_mpi_cmp_mpi( param, &U ) <= 0 )
    {
        ret = 0;
    }

cleanup:
    mbedtls_mpi_free( &L ); mbedtls_mpi_free( &U );
    return( ret );
}